

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariables.cxx
# Opt level: O1

void __thiscall
cmDebugger::cmDebuggerVariables::cmDebuggerVariables
          (cmDebuggerVariables *this,
          shared_ptr<cmDebugger::cmDebuggerVariablesManager> *variablesManager,string *name,
          bool supportsVariableType,
          function<std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_()>
          *getKeyValuesFunction)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 uVar5;
  long lVar6;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  this->_vptr_cmDebuggerVariables = (_func_int **)&PTR_HandleVariablesRequest_00a5dae0;
  LOCK();
  UNLOCK();
  lVar6 = NextId + 1;
  this->Id = NextId;
  NextId = lVar6;
  paVar1 = &(this->Name).field_2;
  (this->Name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar5 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Name).field_2 + 8) = uVar5;
  }
  else {
    (this->Name)._M_dataplus._M_p = pcVar3;
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->Name)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  (this->Value)._M_dataplus._M_p = (pointer)&(this->Value).field_2;
  (this->Value)._M_string_length = 0;
  (this->Value).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)&(this->GetKeyValuesFunction).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->GetKeyValuesFunction).super__Function_base._M_functor + 8) = 0;
  (this->GetKeyValuesFunction).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->GetKeyValuesFunction)._M_invoker = getKeyValuesFunction->_M_invoker;
  if ((getKeyValuesFunction->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar5 = *(undefined8 *)((long)&(getKeyValuesFunction->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->GetKeyValuesFunction).super__Function_base._M_functor =
         *(undefined8 *)&(getKeyValuesFunction->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->GetKeyValuesFunction).super__Function_base._M_functor + 8) = uVar5
    ;
    (this->GetKeyValuesFunction).super__Function_base._M_manager =
         (getKeyValuesFunction->super__Function_base)._M_manager;
    (getKeyValuesFunction->super__Function_base)._M_manager = (_Manager_type)0x0;
    getKeyValuesFunction->_M_invoker = (_Invoker_type)0x0;
  }
  *(undefined8 *)
   ((long)&(this->SubVariables).
           super__Vector_base<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->SubVariables).
           super__Vector_base<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->SubVariables).
  super__Vector_base<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SubVariables).
  super__Vector_base<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->EnableSorting = true;
  this->SupportsVariableType = supportsVariableType;
  (this->VariablesManager).
  super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (variablesManager->
       super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  (this->VariablesManager).
  super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (variablesManager->
           super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (variablesManager->
  super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->VariablesManager).
  super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var4;
  (variablesManager->
  super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmDebuggerVariables.cxx:56:9)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmDebuggerVariables.cxx:56:9)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  cmDebuggerVariablesManager::RegisterHandler
            ((this->VariablesManager).
             super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,this->Id,
             (function<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_(const_dap::VariablesRequest_&)>
              *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return;
}

Assistant:

cmDebuggerVariables::cmDebuggerVariables(
  std::shared_ptr<cmDebuggerVariablesManager> variablesManager,
  std::string name, bool supportsVariableType,
  std::function<std::vector<cmDebuggerVariableEntry>()> getKeyValuesFunction)
  : Id(NextId.fetch_add(1))
  , Name(std::move(name))
  , GetKeyValuesFunction(std::move(getKeyValuesFunction))
  , SupportsVariableType(supportsVariableType)
  , VariablesManager(std::move(variablesManager))
{
  VariablesManager->RegisterHandler(
    Id, [this](dap::VariablesRequest const& request) {
      (void)request;
      return this->HandleVariablesRequest();
    });
}